

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderIndexingTests.cpp
# Opt level: O2

ShaderEvalFunc vkt::sr::anon_unknown_0::getArrayCoordsEvalFunc(DataType dataType)

{
  if (dataType - TYPE_FLOAT < 4) {
    return (ShaderEvalFunc)(&PTR_evalArrayCoordsFloat_00bd1e20)[dataType - TYPE_FLOAT];
  }
  return (ShaderEvalFunc)0x0;
}

Assistant:

static ShaderEvalFunc getArrayCoordsEvalFunc (DataType dataType)
{
	if (dataType == TYPE_FLOAT)				return evalArrayCoordsFloat;
	else if (dataType == TYPE_FLOAT_VEC2)	return evalArrayCoordsVec2;
	else if (dataType == TYPE_FLOAT_VEC3)	return evalArrayCoordsVec3;
	else if (dataType == TYPE_FLOAT_VEC4)	return evalArrayCoordsVec4;

	DE_FATAL("Invalid data type.");
	return NULL;
}